

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O1

int __thiscall QMainWindowLayoutState::remove(QMainWindowLayoutState *this,char *__filename)

{
  QArrayData *pQVar1;
  CutResult CVar2;
  long in_FS_OFFSET;
  QArrayData *d;
  qsizetype p;
  QArrayData *local_58;
  void *pvStack_50;
  long local_48;
  qsizetype local_40;
  qsizetype local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (**(int **)(__filename + 8) == 1) {
    local_38 = 1;
    local_40 = -1;
    CVar2 = QtPrivate::QContainerImplHelper::mid
                      (*(qsizetype *)(__filename + 0x10),&local_38,&local_40);
    if (CVar2 < Full) {
      local_58 = (QArrayData *)0x0;
      pvStack_50 = (void *)0x0;
      local_48 = 0;
    }
    else if (CVar2 == Full) {
      local_58 = *(QArrayData **)__filename;
      pvStack_50 = *(void **)(__filename + 8);
      local_48 = *(long *)(__filename + 0x10);
      if (local_58 != (QArrayData *)0x0) {
        LOCK();
        (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_58->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    else {
      local_58 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
      pvStack_50 = (void *)QArrayData::allocate(&local_58,4,0x10,local_40,KeepSize);
      local_48 = local_40;
      pQVar1 = local_58;
      if (local_40 == 0) {
        local_48 = 0;
      }
      else {
        memcpy(pvStack_50,(void *)(local_38 * 4 + *(long *)(__filename + 8)),local_40 * 4);
      }
      local_58 = pQVar1;
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,4,0x10);
        }
      }
    }
    QDockAreaLayout::remove(&this->dockAreaLayout,(char *)&local_58);
  }
  else {
    if (**(int **)(__filename + 8) != 0) goto LAB_0043876b;
    local_38 = 1;
    local_40 = -1;
    CVar2 = QtPrivate::QContainerImplHelper::mid
                      (*(qsizetype *)(__filename + 0x10),&local_38,&local_40);
    if (CVar2 < Full) {
      local_58 = (QArrayData *)0x0;
      pvStack_50 = (void *)0x0;
      local_48 = 0;
    }
    else if (CVar2 == Full) {
      local_58 = *(QArrayData **)__filename;
      pvStack_50 = *(void **)(__filename + 8);
      local_48 = *(long *)(__filename + 0x10);
      if (local_58 != (QArrayData *)0x0) {
        LOCK();
        (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_58->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    else {
      local_58 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
      pvStack_50 = (void *)QArrayData::allocate(&local_58,4,0x10,local_40,KeepSize);
      local_48 = local_40;
      pQVar1 = local_58;
      if (local_40 == 0) {
        local_48 = 0;
      }
      else {
        memcpy(pvStack_50,(void *)(local_38 * 4 + *(long *)(__filename + 8)),local_40 * 4);
      }
      local_58 = pQVar1;
      if (pQVar1 != (QArrayData *)0x0) {
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        LOCK();
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar1,4,0x10);
        }
      }
    }
    QToolBarAreaLayout::remove(&this->toolBarAreaLayout,(char *)&local_58);
  }
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,4,0x10);
    }
  }
LAB_0043876b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QMainWindowLayoutState::remove(const QList<int> &path)
{
    int i = path.first();

#if QT_CONFIG(toolbar)
    if (i == 0)
        toolBarAreaLayout.remove(path.mid(1));
#endif

#if QT_CONFIG(dockwidget)
    if (i == 1)
        dockAreaLayout.remove(path.mid(1));
#endif // QT_CONFIG(dockwidget)
}